

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ACT_TYPE despot::POMCP::UpperBoundAction(VNode *vnode,double explore_constant)

{
  pointer ppQVar1;
  int iVar2;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar3;
  ulong uVar4;
  ACT_TYPE action;
  ulong uVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  double dVar9;
  
  pvVar3 = VNode::children(vnode);
  uVar4 = 0xffffffffffffffff;
  uVar5 = 0;
  dVar6 = -INFINITY;
  while( true ) {
    ppQVar1 = (pvVar3->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar3->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar1 >> 3) <= uVar5) {
      if ((int)uVar4 != -1) {
        return (int)uVar4;
      }
      __assert_fail("best_action != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/pomcp.cpp"
                    ,0xc3,"static ACT_TYPE despot::POMCP::UpperBoundAction(const VNode *, double)");
    }
    iVar2 = QNode::count(ppQVar1[uVar5]);
    if (iVar2 == 0) break;
    dVar7 = QNode::value((pvVar3->
                         super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar5]);
    iVar2 = VNode::count(vnode);
    _Var8 = std::log<int>(iVar2 + 1);
    iVar2 = QNode::count((pvVar3->
                         super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar5]);
    dVar9 = _Var8 / (double)iVar2;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar7 = dVar9 * explore_constant + dVar7;
    if (dVar6 < dVar7) {
      uVar4 = uVar5;
    }
    uVar4 = uVar4 & 0xffffffff;
    if (dVar7 <= dVar6) {
      dVar7 = dVar6;
    }
    uVar5 = uVar5 + 1;
    dVar6 = dVar7;
  }
  return (ACT_TYPE)uVar5;
}

Assistant:

ACT_TYPE POMCP::UpperBoundAction(const VNode* vnode, double explore_constant) {
	const vector<QNode*>& qnodes = vnode->children();
	double best_ub = Globals::NEG_INFTY;
	ACT_TYPE best_action = -1;

	/*
	 int total = 0;
	 for (ACT_TYPE action = 0; action < qnodes.size(); action ++) {
	 total += qnodes[action]->count();
	 double ub = qnodes[action]->value() + explore_constant * sqrt(log(vnode->count() + 1) / qnodes[action]->count());
	 cout << action << " " << ub << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
	 }
	 */

	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		if (qnodes[action]->count() == 0)
			return action;

		double ub = qnodes[action]->value()
			+ explore_constant
				* sqrt(log(vnode->count() + 1) / qnodes[action]->count());

		if (ub > best_ub) {
			best_ub = ub;
			best_action = action;
		}
	}

	assert(best_action != -1);
	return best_action;
}